

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrGraphicsBindingOpenGLXlibKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *this;
  string type_prefix;
  string glxcontext_prefix;
  string glxdrawable_prefix;
  string glxfbconfig_prefix;
  string visualid_prefix;
  string xdisplay_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  string local_7a8;
  ostringstream oss_xDisplay;
  uint auStack_770 [88];
  ostringstream oss_glxContext;
  uint auStack_5f8 [88];
  ostringstream oss_glxDrawable;
  uint auStack_480 [88];
  ostringstream oss_glxFBConfig;
  uint auStack_308 [88];
  ostringstream oss_visualid;
  
  PointerToHexString<XrGraphicsBindingOpenGLXlibKHR>
            ((XrGraphicsBindingOpenGLXlibKHR *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_xDisplay);
  std::__cxx11::string::~string((string *)&oss_xDisplay);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_xDisplay,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_xDisplay);
    std::__cxx11::string::~string((string *)&oss_xDisplay);
  }
  else {
    auStack_770[6] = 0;
    auStack_770[7] = 0;
    auStack_770[8] = 0;
    auStack_770[9] = 0;
    auStack_770[2] = 0;
    auStack_770[3] = 0;
    auStack_770[4] = 0;
    auStack_770[5] = 0;
    auStack_770[0] = 0;
    auStack_770[1] = 0;
    _oss_xDisplay = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_xDisplay);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_xDisplay);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_7a8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_7a8,contents);
  std::__cxx11::string::~string((string *)&local_7a8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&xdisplay_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&xdisplay_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_xDisplay);
    *(uint *)((long)auStack_770 + *(long *)(_oss_xDisplay + -0x18)) =
         *(uint *)((long)auStack_770 + *(long *)(_oss_xDisplay + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_xDisplay);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"Display*",&xdisplay_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_visualid);
    std::__cxx11::string::~string((string *)&oss_visualid);
    std::__cxx11::string::string((string *)&visualid_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&visualid_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_visualid);
    poVar4 = std::operator<<((ostream *)&oss_visualid,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&visualid_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_glxFBConfig
              );
    std::__cxx11::string::~string((string *)&oss_glxFBConfig);
    std::__cxx11::string::string((string *)&glxfbconfig_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&glxfbconfig_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_glxFBConfig);
    *(uint *)((long)auStack_308 + *(long *)(_oss_glxFBConfig + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(_oss_glxFBConfig + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_glxFBConfig);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"GLXFBConfig",&glxfbconfig_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_glxDrawable
              );
    std::__cxx11::string::~string((string *)&oss_glxDrawable);
    std::__cxx11::string::string((string *)&glxdrawable_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&glxdrawable_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_glxDrawable);
    *(uint *)((long)auStack_480 + *(long *)(_oss_glxDrawable + -0x18)) =
         *(uint *)((long)auStack_480 + *(long *)(_oss_glxDrawable + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_glxDrawable);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"GLXDrawable",&glxdrawable_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_glxContext)
    ;
    std::__cxx11::string::~string((string *)&oss_glxContext);
    std::__cxx11::string::string((string *)&glxcontext_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&glxcontext_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_glxContext);
    *(uint *)((long)auStack_5f8 + *(long *)(_oss_glxContext + -0x18)) =
         *(uint *)((long)auStack_5f8 + *(long *)(_oss_glxContext + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_glxContext);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[11],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [11])"GLXContext",&glxcontext_prefix,&local_7c8);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_glxContext);
    std::__cxx11::string::~string((string *)&glxcontext_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_glxDrawable);
    std::__cxx11::string::~string((string *)&glxdrawable_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_glxFBConfig);
    std::__cxx11::string::~string((string *)&glxfbconfig_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_visualid);
    std::__cxx11::string::~string((string *)&visualid_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_xDisplay);
    std::__cxx11::string::~string((string *)&xdisplay_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrGraphicsBindingOpenGLXlibKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string xdisplay_prefix = prefix;
        xdisplay_prefix += "xDisplay";
        std::ostringstream oss_xDisplay;
        oss_xDisplay << std::hex << reinterpret_cast<const void*>(value->xDisplay);
        contents.emplace_back("Display*", xdisplay_prefix, oss_xDisplay.str());
        std::string visualid_prefix = prefix;
        visualid_prefix += "visualid";
        std::ostringstream oss_visualid;
        oss_visualid << "0x" << std::hex << (value->visualid);
        contents.emplace_back("uint32_t", visualid_prefix, oss_visualid.str());
        std::string glxfbconfig_prefix = prefix;
        glxfbconfig_prefix += "glxFBConfig";
        std::ostringstream oss_glxFBConfig;
        oss_glxFBConfig << std::hex << reinterpret_cast<const void*>(value->glxFBConfig);
        contents.emplace_back("GLXFBConfig", glxfbconfig_prefix, oss_glxFBConfig.str());
        std::string glxdrawable_prefix = prefix;
        glxdrawable_prefix += "glxDrawable";
        std::ostringstream oss_glxDrawable;
        oss_glxDrawable << std::hex << reinterpret_cast<const void*>(value->glxDrawable);
        contents.emplace_back("GLXDrawable", glxdrawable_prefix, oss_glxDrawable.str());
        std::string glxcontext_prefix = prefix;
        glxcontext_prefix += "glxContext";
        std::ostringstream oss_glxContext;
        oss_glxContext << std::hex << reinterpret_cast<const void*>(value->glxContext);
        contents.emplace_back("GLXContext", glxcontext_prefix, oss_glxContext.str());
        return true;
    } catch(...) {
    }
    return false;
}